

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_com.c
# Opt level: O0

void hal_h265d_output_scalinglist_packet(void *hal,void *ptr,void *dxva)

{
  int iVar1;
  uint uVar2;
  HalH265dCtx *reg_ctx;
  h265d_dxva2_picture_context_t *dxva_cxt;
  RK_U32 pos;
  RK_U32 j;
  RK_U32 i;
  scalingList_t sl;
  void *dxva_local;
  void *ptr_local;
  void *hal_local;
  
  if ((*(uint *)((long)dxva + 0x18) & 1) != 0) {
    sl.sl_dc._4_8_ = dxva;
    iVar1 = memcmp((void *)((long)dxva + 0x1a6c),*(void **)((long)hal + 0x1a0),1000);
    if (iVar1 != 0) {
      memset(&j,0,0x60c);
      for (pos = 0; pos < 6; pos = pos + 1) {
        for (dxva_cxt._4_4_ = 0; dxva_cxt._4_4_ < 0x10; dxva_cxt._4_4_ = dxva_cxt._4_4_ + 1) {
          *(undefined1 *)
           ((long)&j +
           (ulong)((uint)hal_hevc_diag_scan4x4_y[dxva_cxt._4_4_] * 4 +
                  (uint)hal_hevc_diag_scan4x4_x[dxva_cxt._4_4_]) + (ulong)pos * 0x40) =
               *(undefined1 *)((long)dxva + (ulong)dxva_cxt._4_4_ + (ulong)pos * 0x10 + 0x1a6c);
        }
        for (dxva_cxt._4_4_ = 0; dxva_cxt._4_4_ < 0x40; dxva_cxt._4_4_ = dxva_cxt._4_4_ + 1) {
          uVar2 = (uint)hal_hevc_diag_scan8x8_y[dxva_cxt._4_4_] * 8 +
                  (uint)hal_hevc_diag_scan8x8_x[dxva_cxt._4_4_];
          sl.sl[0][(ulong)pos + 5][(ulong)uVar2 + 0x38] =
               *(RK_U8 *)((long)dxva + (ulong)dxva_cxt._4_4_ + (ulong)pos * 0x40 + 0x1acc);
          sl.sl[1][(ulong)pos + 5][(ulong)uVar2 + 0x38] =
               *(RK_U8 *)((long)dxva + (ulong)dxva_cxt._4_4_ + (ulong)pos * 0x40 + 0x1c4c);
          if (pos < 2) {
            sl.sl[2][(ulong)pos + 5][(ulong)uVar2 + 0x38] =
                 *(RK_U8 *)((long)dxva + (ulong)dxva_cxt._4_4_ + (ulong)pos * 0x40 + 0x1dcc);
          }
        }
        *(RK_U8 *)((long)(sl.sl_dc + -2) + (ulong)pos + 4) =
             *(RK_U8 *)((long)dxva + (ulong)pos + 0x1e4c);
        if (pos < 2) {
          *(RK_U8 *)((long)(sl.sl_dc + -1) + (ulong)pos + 4) =
               *(RK_U8 *)((long)dxva + (ulong)pos + 0x1e52);
        }
      }
      hal_record_scaling_list(*(scalingFactor_t **)((long)hal + 0x198),(scalingList_t *)&j);
    }
    memcpy(ptr,*(void **)((long)hal + 0x198),0x550);
  }
  return;
}

Assistant:

void hal_h265d_output_scalinglist_packet(void *hal, void *ptr, void *dxva)
{
    scalingList_t sl;
    RK_U32 i, j, pos;
    h265d_dxva2_picture_context_t *dxva_cxt = (h265d_dxva2_picture_context_t*)dxva;
    HalH265dCtx *reg_ctx = ( HalH265dCtx *)hal;
    if (!dxva_cxt->pp.scaling_list_enabled_flag) {
        return;
    }
    if (memcmp((void*)&dxva_cxt->qm, reg_ctx->scaling_qm, sizeof(DXVA_Qmatrix_HEVC))) {
        memset(&sl, 0, sizeof(scalingList_t));
        for (i = 0; i < 6; i++) {
            for (j = 0; j < 16; j++) {
                pos = 4 * hal_hevc_diag_scan4x4_y[j] + hal_hevc_diag_scan4x4_x[j];
                sl.sl[0][i][pos] = dxva_cxt->qm.ucScalingLists0[i][j];
            }

            for (j = 0; j < 64; j++) {
                pos = 8 * hal_hevc_diag_scan8x8_y[j] + hal_hevc_diag_scan8x8_x[j];
                sl.sl[1][i][pos] =  dxva_cxt->qm.ucScalingLists1[i][j];
                sl.sl[2][i][pos] =  dxva_cxt->qm.ucScalingLists2[i][j];

                if (i < 2)
                    sl.sl[3][i][pos] =  dxva_cxt->qm.ucScalingLists3[i][j];
            }

            sl.sl_dc[0][i] =  dxva_cxt->qm.ucScalingListDCCoefSizeID2[i];
            if (i < 2)
                sl.sl_dc[1][i] =  dxva_cxt->qm.ucScalingListDCCoefSizeID3[i];
        }
        hal_record_scaling_list((scalingFactor_t *)reg_ctx->scaling_rk, &sl);
    }
    memcpy(ptr, reg_ctx->scaling_rk, sizeof(scalingFactor_t));
}